

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubD::ClearComponentMarks
          (ON_SubD *this,bool bClearVertexMarks,bool bClearEdgeMarks,bool bClearFaceMarks,
          ON_SimpleArray<const_ON_SubDComponentBase_*> *marked_component_list)

{
  bool bVar1;
  ON_SubDFace *local_110;
  ON_SubDFace *local_108;
  ON_SubDFace *f;
  ON_SubDFaceIterator fit;
  ON_SubDEdge *local_c0;
  ON_SubDEdge *e;
  ON_SubDEdgeIterator eit;
  ON_SubDVertex *local_68;
  ON_SubDVertex *v;
  ON_SubDVertexIterator vit;
  uint clear_count;
  ON_SimpleArray<const_ON_SubDComponentBase_*> *marked_component_list_local;
  bool bClearFaceMarks_local;
  bool bClearEdgeMarks_local;
  bool bClearVertexMarks_local;
  ON_SubD *this_local;
  
  vit.m_component_ptr.m_ptr._4_4_ = 0;
  if (bClearVertexMarks) {
    ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&v,this);
    local_68 = ON_SubDVertexIterator::FirstVertex((ON_SubDVertexIterator *)&v);
    while (local_68 != (ON_SubDVertex *)0x0) {
      bVar1 = ON_ComponentStatus::ClearRuntimeMark(&(local_68->super_ON_SubDComponentBase).m_status)
      ;
      if (bVar1) {
        if (marked_component_list != (ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0) {
          eit.m_component_ptr.m_ptr = (ON__UINT_PTR)local_68;
          ON_SimpleArray<const_ON_SubDComponentBase_*>::Append
                    (marked_component_list,(ON_SubDComponentBase **)&eit.m_component_ptr);
        }
        vit.m_component_ptr.m_ptr._4_4_ = vit.m_component_ptr.m_ptr._4_4_ + 1;
      }
      local_68 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&v);
    }
    ON_SubDVertexIterator::~ON_SubDVertexIterator((ON_SubDVertexIterator *)&v);
  }
  if (bClearEdgeMarks) {
    ON_SubDEdgeIterator::ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e,this);
    local_c0 = ON_SubDEdgeIterator::FirstEdge((ON_SubDEdgeIterator *)&e);
    while (local_c0 != (ON_SubDEdge *)0x0) {
      bVar1 = ON_ComponentStatus::ClearRuntimeMark(&(local_c0->super_ON_SubDComponentBase).m_status)
      ;
      if (bVar1) {
        if (marked_component_list != (ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0) {
          fit.m_component_ptr.m_ptr = (ON__UINT_PTR)local_c0;
          ON_SimpleArray<const_ON_SubDComponentBase_*>::Append
                    (marked_component_list,(ON_SubDComponentBase **)&fit.m_component_ptr);
        }
        vit.m_component_ptr.m_ptr._4_4_ = vit.m_component_ptr.m_ptr._4_4_ + 1;
      }
      local_c0 = ON_SubDEdgeIterator::NextEdge((ON_SubDEdgeIterator *)&e);
    }
    ON_SubDEdgeIterator::~ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e);
  }
  if (bClearFaceMarks) {
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&f,this);
    local_108 = ON_SubDFaceIterator::FirstFace((ON_SubDFaceIterator *)&f);
    while (local_108 != (ON_SubDFace *)0x0) {
      bVar1 = ON_ComponentStatus::ClearRuntimeMark
                        (&(local_108->super_ON_SubDComponentBase).m_status);
      if (bVar1) {
        if (marked_component_list != (ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0) {
          local_110 = local_108;
          ON_SimpleArray<const_ON_SubDComponentBase_*>::Append
                    (marked_component_list,(ON_SubDComponentBase **)&local_110);
        }
        vit.m_component_ptr.m_ptr._4_4_ = vit.m_component_ptr.m_ptr._4_4_ + 1;
      }
      local_108 = ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&f);
    }
    ON_SubDFaceIterator::~ON_SubDFaceIterator((ON_SubDFaceIterator *)&f);
  }
  return vit.m_component_ptr.m_ptr._4_4_;
}

Assistant:

unsigned int ON_SubD::ClearComponentMarks(
  bool bClearVertexMarks,
  bool bClearEdgeMarks,
  bool bClearFaceMarks,
  ON_SimpleArray< const ON_SubDComponentBase* >* marked_component_list
) const
{
  unsigned int clear_count = 0;

  if (bClearVertexMarks)
  {
    ON_SubDVertexIterator vit(*this);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (v->m_status.ClearRuntimeMark())
      {
        if (nullptr != marked_component_list)
          marked_component_list->Append(v);
        clear_count++;
      }
    }
  }

  if (bClearEdgeMarks)
  {
    ON_SubDEdgeIterator eit(*this);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (e->m_status.ClearRuntimeMark())
      {
        if (nullptr != marked_component_list)
          marked_component_list->Append(e);
        clear_count++;
      }
    }
  }

  if (bClearFaceMarks)
  {
    ON_SubDFaceIterator fit(*this);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (f->m_status.ClearRuntimeMark())
      {
        if (nullptr != marked_component_list)
          marked_component_list->Append(f);
        clear_count++;
      }
    }
  }

  return clear_count;
}